

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O1

LinkIndex __thiscall
iDynTree::Traversal::getParentLinkIndexFromJointIndex
          (Traversal *this,Model *model,JointIndex jntIdx)

{
  Link *this_00;
  int iVar1;
  int iVar2;
  IJoint *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  LinkIndex LVar6;
  long lVar4;
  
  pIVar3 = Model::getJoint(model,jntIdx);
  lVar4 = LINK_INVALID_INDEX;
  if (pIVar3 != (IJoint *)0x0) {
    iVar1 = (*pIVar3->_vptr_IJoint[7])(pIVar3);
    iVar2 = (*pIVar3->_vptr_IJoint[8])(pIVar3);
    lVar4 = CONCAT44(extraout_var_00,iVar2);
    lVar5 = (long)(this->linkIndexToTraversalIndex).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar4];
    if (((lVar5 != -1) &&
        (this_00 = (this->parents).
                   super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar5], this_00 != (Link *)0x0)) &&
       (LVar6 = Link::getIndex(this_00), LVar6 == CONCAT44(extraout_var,iVar1))) {
      lVar4 = CONCAT44(extraout_var,iVar1);
    }
  }
  return lVar4;
}

Assistant:

LinkIndex Traversal::getParentLinkIndexFromJointIndex(const Model& model, const JointIndex jntIdx) const
{
    // Get the two links connected by this joint
    IJointConstPtr jnt = model.getJoint(jntIdx);
    if (!jnt)
    {
        return LINK_INVALID_INDEX;
    }

    LinkIndex link1 = jnt->getFirstAttachedLink();
    LinkIndex link2 = jnt->getSecondAttachedLink();

    // Get the traversal index of the child link (according to the traversal)
    LinkIndex parentLink;
    if( this->isParentOf(link1,link2) )
    {
        parentLink = link1;
    }
    else
    {
        parentLink = link2;
    }

    return parentLink;
}